

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree.cpp
# Opt level: O2

void node_click_proc(Am_Object *command)

{
  int iVar1;
  int iVar2;
  Am_Value *pAVar3;
  Am_Wrapper *pAVar4;
  int iVar5;
  long lVar6;
  Am_Object nodes;
  Am_Object lines;
  Am_Object node;
  Am_Object inter;
  Am_Value_List parents;
  
  Am_Object::Get_Owner(&inter,(Am_Slot_Flags)command);
  pAVar3 = (Am_Value *)Am_Object::Get((ushort)&inter,0x11a);
  Am_Object::Am_Object(&node,pAVar3);
  pAVar3 = (Am_Value *)Am_Object::Get((ushort)&node,0x85);
  iVar1 = Am_Value::operator_cast_to_int(pAVar3);
  iVar5 = iVar1;
  do {
    iVar2 = iVar1;
    iVar1 = tree[iVar2];
    tree[iVar2] = iVar5;
    iVar5 = iVar2;
  } while (iVar1 != iVar2);
  Am_Value_List::Am_Value_List(&parents);
  for (lVar6 = 0; lVar6 != 0x28; lVar6 = lVar6 + 4) {
    Am_Value_List::Add(&parents,*(undefined4 *)((long)tree + lVar6),1,1);
  }
  Am_Object::Get_Owner(&nodes,(Am_Slot_Flags)&inter);
  Am_Object::Get_Sibling(&lines,(Am_Slot_Key)&nodes,(ulong)LINES);
  pAVar4 = Am_Value_List::operator_cast_to_Am_Wrapper_(&parents);
  Am_Object::Set((ushort)&nodes,(Am_Wrapper *)0xa2,(ulong)pAVar4);
  pAVar4 = Am_Value_List::operator_cast_to_Am_Wrapper_(&parents);
  Am_Object::Set((ushort)&lines,(Am_Wrapper *)0xa2,(ulong)pAVar4);
  Am_Object::~Am_Object(&lines);
  Am_Object::~Am_Object(&nodes);
  Am_Value_List::~Am_Value_List(&parents);
  Am_Object::~Am_Object(&node);
  Am_Object::~Am_Object(&inter);
  return;
}

Assistant:

Am_Define_Method(Am_Object_Method, void, node_click, (Am_Object command))
{
  Am_Object inter = command.Get_Owner();
  Am_Object node = inter.Get(Am_START_OBJECT);
  int rank = node.Get(Am_RANK);
  int prev_rank = rank;
  int next_rank = tree[rank];
  while (next_rank != rank) {
    tree[rank] = prev_rank;
    prev_rank = rank;
    rank = next_rank;
    next_rank = tree[rank];
  }
  tree[rank] = prev_rank;

  int i;
  Am_Value_List parents;
  for (i = 0; i < 10; ++i)
    parents.Add(tree[i]);
  Am_Object nodes = inter.Get_Owner();
  Am_Object lines = nodes.Get_Sibling(LINES);
  nodes.Set(Am_ITEMS, parents);
  lines.Set(Am_ITEMS, parents);
}